

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  _Bool _Var1;
  uint i;
  array_container_t *src;
  container_t *pcVar2;
  uint8_t typecode;
  int iVar3;
  uint8_t local_32;
  uint8_t local_31;
  container_t *local_30;
  
  i = ra_get_index(x1_arr,hb);
  if (-1 < (int)i) {
    local_31 = x1_arr->typecodes[i & 0xffff];
    iVar3 = lb_end + 1;
    src = (array_container_t *)get_writable_copy_if_shared(x1_arr->containers[i & 0xffff],&local_31)
    ;
    local_30 = (container_t *)0x0;
    if (local_31 == '\x03') {
      iVar3 = run_container_negation_range_inplace
                        ((run_container_t *)src,(uint)lb_start,iVar3,&local_30);
      typecode = (uint8_t)iVar3;
    }
    else {
      if (local_31 == '\x02') {
        _Var1 = array_container_negation_range_inplace(src,(uint)lb_start,iVar3,&local_30);
      }
      else {
        _Var1 = bitset_container_negation_range_inplace
                          ((bitset_container_t *)src,(uint)lb_start,iVar3,&local_30);
      }
      typecode = '\x02' - _Var1;
    }
    pcVar2 = local_30;
    iVar3 = container_get_cardinality(local_30,typecode);
    if (iVar3 == 0) {
      container_free(pcVar2,typecode);
      ra_remove_at_index(x1_arr,i);
    }
    else {
      x1_arr->containers[i] = pcVar2;
      x1_arr->typecodes[i] = typecode;
    }
    return;
  }
  pcVar2 = container_range_of_ones((uint)lb_start,lb_end + 1,&local_32);
  ra_insert_new_key_value_at(x1_arr,~i,hb,pcVar2,local_32);
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}